

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADABUMathQuaternion.cpp
# Opt level: O1

Vector3 * __thiscall COLLADABU::Math::Quaternion::operator*(Quaternion *this,Vector3 *v)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  Vector3 *kSum;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  
  dVar8 = this->x;
  dVar1 = (v->field_0).field_0.z;
  dVar6 = this->w + this->w;
  (kSum->field_0).field_0.x = 0.0;
  (kSum->field_0).field_0.y = 0.0;
  (kSum->field_0).field_0.z = 0.0;
  dVar3 = this->y;
  dVar11 = this->z;
  dVar4 = (v->field_0).field_0.x;
  dVar5 = (v->field_0).field_0.y;
  dVar7 = dVar1 * dVar3 - dVar5 * dVar11;
  dVar9 = dVar4 * dVar11 - dVar1 * dVar8;
  dVar2 = dVar5 * dVar8 - dVar4 * dVar3;
  dVar10 = dVar2 * dVar3 - dVar9 * dVar11;
  dVar11 = dVar7 * dVar11 - dVar2 * dVar8;
  dVar8 = dVar9 * dVar8 - dVar3 * dVar7;
  (kSum->field_0).field_0.x = dVar6 * dVar7 + dVar4 + dVar10 + dVar10;
  (kSum->field_0).field_0.y = dVar6 * dVar9 + dVar5 + dVar11 + dVar11;
  (kSum->field_0).field_0.z = dVar2 * dVar6 + dVar1 + dVar8 + dVar8;
  return kSum;
}

Assistant:

Vector3 Quaternion::operator* ( const Vector3& v ) const
        {
            // nVidia SDK implementation
            Vector3 uv, uuv;
            Vector3 qvec( x, y, z );
            uv = qvec.crossProduct( v );
            uuv = qvec.crossProduct( uv );
            uv *= ( 2.0f * w );
            uuv *= 2.0f;

            return v + uv + uuv;

        }